

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  istream *piVar2;
  string line;
  long *local_50 [2];
  long local_40 [2];
  
  init_step();
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  while( true ) {
    piVar2 = std::operator>>((istream *)&std::cin,(string *)local_50);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    iVar1 = std::__cxx11::string::compare((char *)local_50);
    if (iVar1 == 0) break;
    iVar1 = std::__cxx11::string::compare((char *)local_50);
    if (iVar1 == 0) break;
    iVar1 = std::__cxx11::string::compare((char *)local_50);
    if (iVar1 == 0) break;
    iVar1 = std::__cxx11::string::compare((char *)local_50);
    if (iVar1 == 0) break;
    iVar1 = std::__cxx11::string::compare((char *)local_50);
    if (iVar1 == 0) {
      Login();
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)local_50);
      if (iVar1 == 0) {
        GetStudent();
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)local_50);
        if (iVar1 == 0) {
          GetAdmin();
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)local_50);
          if (iVar1 == 0) {
            GetLabEmployees();
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)local_50);
            if (iVar1 == 0) {
              GetProfessor();
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)local_50);
              if (iVar1 == 0) {
                AddNewUser();
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)local_50);
                if (iVar1 == 0) break;
                iVar1 = std::__cxx11::string::compare((char *)local_50);
                if (iVar1 == 0) {
                  AddNewRoom();
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)local_50);
                  if (iVar1 == 0) {
                    CanUserEnter();
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)local_50);
                    if (iVar1 == 0) {
                      AddSpecialAccess();
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)local_50);
                      if (iVar1 == 0) {
                        RemoveSpecialAccess();
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)local_50);
                        if (iVar1 == 0) {
                          ChangeGroupsForLabEmployees();
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare((char *)local_50);
                          if (iVar1 == 0) {
                            ChangeGroupForStudent();
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare((char *)local_50);
                            if (iVar1 == 0) {
                              ShowAllUsers();
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare((char *)local_50);
                              if (iVar1 == 0) {
                                ShowAllRooms();
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return 0;
}

Assistant:

int main() {
    init_step();
    string line = "";
    while(cin>>line) {
        if("Logout" == line||line == "Exit"||line == "exit" || line == "out"){
            return 0;
        }else if("Login" == line){
            Login();
        }else if(line == "GetStudent"){
            GetStudent();
        }else if(line == "GetAdmin"){
            GetAdmin();
        }else if(line == "GetLabEmployees"){
            GetLabEmployees();
        }else if(line == "GetProfessor"){
            GetProfessor();
        }else if(line  == "AddNewUser"){
            AddNewUser();
        }else if(line == "Exit"){
            return 0;
        }else if(line  == "AddNewRoom"){
            AddNewRoom();
        }else if(line == "CanUserEnter"){
            CanUserEnter();
        }else if(line == "AddSpecialAccess"){
            AddSpecialAccess();
        }else if(line == "RemoveSpecialAccess"){
            RemoveSpecialAccess();
        }else if(line == "ChangeGroupsForLabEmployees"){
            ChangeGroupsForLabEmployees();
        }else if(line == "ChangeGroupForStudent"){
            ChangeGroupForStudent();
        }else if(line == "ShowAllUsers"){
            ShowAllUsers();
        }else if(line == "ShowAllRooms"){
            ShowAllRooms();
        }



    }

    return 0;
}